

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassSerializeBinaryField
          (Generator *this,GeneratorOptions *options,Printer *printer,FieldDescriptor *field)

{
  bool bVar1;
  CppType CVar2;
  Type TVar3;
  FieldDescriptor *this_00;
  FieldDescriptor *this_01;
  GeneratorOptions *options_00;
  uint *args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  FieldDescriptor *field_00;
  AlphaNum *a;
  GeneratorOptions *options_01;
  GeneratorOptions *options_02;
  AlphaNum *a_00;
  BytesMode in_R8D;
  undefined1 in_R9B;
  char *pcVar5;
  string in_stack_ffffffffffffff48;
  string typed_annotation;
  string local_68;
  string local_48;
  
  bVar1 = FieldDescriptor::has_presence(field);
  if ((bVar1) && (CVar2 = FieldDescriptor::cpp_type(field), CVar2 != CPPTYPE_MESSAGE)) {
    (anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
              (&typed_annotation,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
               (FieldDescriptor *)0x0,false,false,false,BYTES_DEFAULT,
               (bool)in_stack_ffffffffffffff48);
    (anonymous_namespace)::JSFieldIndex_abi_cxx11_
              ((string *)&stack0xffffffffffffff48,(_anonymous_namespace_ *)field,field_00);
    args_1 = (uint *)&stack0xffffffffffffff48;
    io::Printer::Print<char[6],std::__cxx11::string,char[5],std::__cxx11::string>
              (printer,"  f = /** @type {$type$} */ (jspb.Message.getField(message, $index$));\n",
               (char (*) [6])0x3e57aa,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1,
               (char (*) [5])0x42d84f,&typed_annotation);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
  }
  else {
    (anonymous_namespace)::JSGetterName_abi_cxx11_
              (&typed_annotation,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x2,
               (FieldDescriptor *)0x0,in_R8D,(bool)in_R9B);
    FieldDescriptor::is_map(field);
    args_1 = (uint *)&typed_annotation;
    io::Printer::Print<char[5],std::__cxx11::string,char[7],char_const*>
              (printer,"  f = message.get$name$($nolazy$);\n",(char (*) [5])0x3de831,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1,
               (char (*) [7])"nolazy",(char **)&stack0xffffffffffffff48);
  }
  std::__cxx11::string::~string((string *)&typed_annotation);
  bVar1 = FieldDescriptor::is_map(field);
  if (bVar1) {
    pcVar5 = "  if (f && f.getLength() > 0) {\n";
  }
  else {
    pcVar5 = "  if (f.length > 0) {\n";
    if ((~(byte)field[1] & 0x60) != 0) {
      bVar1 = FieldDescriptor::has_presence(field);
      if (bVar1) {
        pcVar5 = "  if (f != null) {\n";
      }
      else {
        CVar2 = FieldDescriptor::cpp_type(field);
        args_1 = &switchD_0029fa05::switchdataD_003d32c4;
        switch(CVar2) {
        case CPPTYPE_INT32:
        case CPPTYPE_INT64:
        case CPPTYPE_UINT32:
        case CPPTYPE_UINT64:
          bVar1 = anon_unknown_0::IsIntegralFieldWithStringJSType(field);
          pcVar5 = "  if (f !== 0) {\n";
          args_1 = (uint *)"  if (parseInt(f, 10) !== 0) {\n";
          if (bVar1) {
            pcVar5 = "  if (parseInt(f, 10) !== 0) {\n";
          }
          break;
        case CPPTYPE_DOUBLE:
        case CPPTYPE_FLOAT:
        case CPPTYPE_ENUM:
          pcVar5 = "  if (f !== 0.0) {\n";
          break;
        case CPPTYPE_BOOL:
          pcVar5 = "  if (f) {\n";
          break;
        case CPPTYPE_STRING:
          break;
        default:
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
                        ,0xcd5,
                        "void google::protobuf::compiler::js::Generator::GenerateClassSerializeBinaryField(const GeneratorOptions &, io::Printer *, const FieldDescriptor *) const"
                       );
        }
      }
    }
  }
  io::Printer::Print<>(printer,pcVar5);
  bVar1 = FieldDescriptor::is_map(field);
  if (bVar1) {
    this_00 = anon_unknown_0::MapFieldKey(field);
    this_01 = anon_unknown_0::MapFieldValue(field);
    strings::AlphaNum::AlphaNum((AlphaNum *)&typed_annotation,*(int *)(field + 4));
    StrCat_abi_cxx11_((string *)&stack0xffffffffffffff48,(protobuf *)&typed_annotation,a);
    (anonymous_namespace)::JSBinaryWriterMethodName_abi_cxx11_
              (&local_68,(_anonymous_namespace_ *)this_00,options_01,(FieldDescriptor *)args_1);
    (anonymous_namespace)::JSBinaryWriterMethodName_abi_cxx11_
              (&local_48,(_anonymous_namespace_ *)this_01,options_02,(FieldDescriptor *)args_1);
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffff48;
    io::Printer::
    Print<char[6],std::__cxx11::string,char[12],std::__cxx11::string,char[14],std::__cxx11::string>
              (printer,"    f.serializeBinary($index$, writer, $keyWriterFn$, $valueWriterFn$",
               (char (*) [6])0x3e57aa,pbVar4,(char (*) [12])"keyWriterFn",&local_68,
               (char (*) [14])"valueWriterFn",&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
    TVar3 = FieldDescriptor::type(this_01);
    pcVar5 = ");\n";
    if (TVar3 == TYPE_MESSAGE) {
      options_00 = (GeneratorOptions *)FieldDescriptor::message_type(this_01);
      (anonymous_namespace)::GetMessagePath_abi_cxx11_
                (&typed_annotation,(_anonymous_namespace_ *)options,options_00,(Descriptor *)pbVar4)
      ;
      io::Printer::Print<char[12],std::__cxx11::string>
                (printer,", $messageType$.serializeBinaryToWriter",(char (*) [12])"messageType",
                 &typed_annotation);
      std::__cxx11::string::~string((string *)&typed_annotation);
    }
  }
  else {
    (anonymous_namespace)::JSBinaryReadWriteMethodName_abi_cxx11_
              ((string *)&stack0xffffffffffffff48,(_anonymous_namespace_ *)field,
               (FieldDescriptor *)0x1,SUB81(args_1,0));
    strings::AlphaNum::AlphaNum((AlphaNum *)&typed_annotation,*(int *)(field + 4));
    StrCat_abi_cxx11_(&local_68,(protobuf *)&typed_annotation,a_00);
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffff48;
    io::Printer::Print<char[7],std::__cxx11::string,char[6],std::__cxx11::string>
              (printer,"    writer.write$method$(\n      $index$,\n      f",(char (*) [7])"method",
               pbVar4,(char (*) [6])0x3e57aa,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
    CVar2 = FieldDescriptor::cpp_type(field);
    if ((CVar2 != CPPTYPE_MESSAGE) || (bVar1 = FieldDescriptor::is_map(field), bVar1)) {
      io::Printer::Print<>(printer,"\n");
    }
    else {
      (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
                (&typed_annotation,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
                 (FieldDescriptor *)pbVar4);
      io::Printer::Print<char[7],std::__cxx11::string>
                (printer,",\n      $submsg$.serializeBinaryToWriter\n",(char (*) [7])"submsg",
                 &typed_annotation);
      std::__cxx11::string::~string((string *)&typed_annotation);
    }
    pcVar5 = "    );\n";
  }
  io::Printer::Print<>(printer,pcVar5);
  io::Printer::Print<>(printer,"  }\n");
  return;
}

Assistant:

void Generator::GenerateClassSerializeBinaryField(
    const GeneratorOptions& options, io::Printer* printer,
    const FieldDescriptor* field) const {
  if (HasFieldPresence(options, field) &&
      field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
    std::string typed_annotation =
        JSFieldTypeAnnotation(options, field,
                              /* is_setter_argument = */ false,
                              /* force_present = */ false,
                              /* singular_if_not_packed = */ false,
                              /* bytes_mode = */ BYTES_DEFAULT);
    printer->Print(
        "  f = /** @type {$type$} */ "
        "(jspb.Message.getField(message, $index$));\n",
        "index", JSFieldIndex(field), "type", typed_annotation);
  } else {
    printer->Print(
        "  f = message.get$name$($nolazy$);\n", "name",
        JSGetterName(options, field, BYTES_U8),
        // No lazy creation for maps containers -- fastpath the empty case.
        "nolazy", field->is_map() ? "true" : "");
  }

  // Print an `if (condition)` statement that evaluates to true if the field
  // goes on the wire.
  if (field->is_map()) {
    printer->Print("  if (f && f.getLength() > 0) {\n");
  } else if (field->is_repeated()) {
    printer->Print("  if (f.length > 0) {\n");
  } else {
    if (HasFieldPresence(options, field)) {
      printer->Print("  if (f != null) {\n");
    } else {
      // No field presence: serialize onto the wire only if value is
      // non-default.  Defaults are documented here:
      // https://goto.google.com/lhdfm
      switch (field->cpp_type()) {
        case FieldDescriptor::CPPTYPE_INT32:
        case FieldDescriptor::CPPTYPE_INT64:
        case FieldDescriptor::CPPTYPE_UINT32:
        case FieldDescriptor::CPPTYPE_UINT64: {
          if (IsIntegralFieldWithStringJSType(field)) {
            // We can use `parseInt` here even though it will not be precise for
            // 64-bit quantities because we are only testing for zero/nonzero,
            // and JS numbers (64-bit floating point values, i.e., doubles) are
            // integer-precise in the range that includes zero.
            printer->Print("  if (parseInt(f, 10) !== 0) {\n");
          } else {
            printer->Print("  if (f !== 0) {\n");
          }
          break;
        }

        case FieldDescriptor::CPPTYPE_ENUM:
        case FieldDescriptor::CPPTYPE_FLOAT:
        case FieldDescriptor::CPPTYPE_DOUBLE:
          printer->Print("  if (f !== 0.0) {\n");
          break;
        case FieldDescriptor::CPPTYPE_BOOL:
          printer->Print("  if (f) {\n");
          break;
        case FieldDescriptor::CPPTYPE_STRING:
          printer->Print("  if (f.length > 0) {\n");
          break;
        default:
          assert(false);
          break;
      }
    }
  }

  // Write the field on the wire.
  if (field->is_map()) {
    const FieldDescriptor* key_field = MapFieldKey(field);
    const FieldDescriptor* value_field = MapFieldValue(field);
    printer->Print(
        "    f.serializeBinary($index$, writer, "
        "$keyWriterFn$, $valueWriterFn$",
        "index", StrCat(field->number()), "keyWriterFn",
        JSBinaryWriterMethodName(options, key_field), "valueWriterFn",
        JSBinaryWriterMethodName(options, value_field));

    if (value_field->type() == FieldDescriptor::TYPE_MESSAGE) {
      printer->Print(", $messageType$.serializeBinaryToWriter", "messageType",
                     GetMessagePath(options, value_field->message_type()));
    }

    printer->Print(");\n");
  } else {
    printer->Print(
        "    writer.write$method$(\n"
        "      $index$,\n"
        "      f",
        "method", JSBinaryReadWriteMethodName(field, /* is_writer = */ true),
        "index", StrCat(field->number()));

    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
        !field->is_map()) {
      printer->Print(
          ",\n"
          "      $submsg$.serializeBinaryToWriter\n",
          "submsg", SubmessageTypeRef(options, field));
    } else {
      printer->Print("\n");
    }

    printer->Print("    );\n");
  }

  // Close the `if`.
  printer->Print("  }\n");
}